

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O2

void Imf_2_5::calculateBytesPerLine
               (Header *header,char *sampleCountBase,int sampleCountXStride,int sampleCountYStride,
               int minX,int maxX,int minY,int maxY,vector<int,_std::allocator<int>_> *xOffsets,
               vector<int,_std::allocator<int>_> *yOffsets,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  pointer puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ChannelList *this;
  const_iterator cVar6;
  ConstIterator CVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int x;
  long lVar12;
  int *piVar13;
  int *piVar14;
  
  this = Header::channels(header);
  cVar6._M_node = (_Base_ptr)ChannelList::begin(this);
  lVar11 = 0;
  while (CVar7 = ChannelList::end(this), (const_iterator)cVar6._M_node != CVar7._i._M_node) {
    iVar2 = (xOffsets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar11];
    iVar3 = (yOffsets->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar11];
    lVar8 = (long)(minX - iVar2);
    lVar9 = (long)(minY - iVar3);
    piVar13 = (int *)(sampleCountBase + sampleCountYStride * lVar9 + sampleCountXStride * lVar8);
    lVar10 = 0;
    for (; lVar12 = lVar8, piVar14 = piVar13, lVar9 <= maxY - iVar3; lVar9 = lVar9 + 1) {
      for (; lVar12 <= maxX - iVar2; lVar12 = lVar12 + 1) {
        iVar4 = *piVar14;
        iVar5 = pixelTypeSize(cVar6._M_node[9]._M_color);
        puVar1 = (bytesPerLine->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar10;
        *puVar1 = *puVar1 + (long)iVar5 * (long)iVar4;
        piVar14 = (int *)((long)piVar14 + (long)sampleCountXStride);
      }
      lVar10 = lVar10 + 1;
      piVar13 = (int *)((long)piVar13 + (long)sampleCountYStride);
    }
    cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
    lVar11 = lVar11 + 1;
  }
  return;
}

Assistant:

void
calculateBytesPerLine (const Header &header,
                       char* sampleCountBase,
                       int sampleCountXStride,
                       int sampleCountYStride,
                       int minX, int maxX,
                       int minY, int maxY,
                       std::vector<int>& xOffsets,
                       std::vector<int>& yOffsets,
                       std::vector<Int64>& bytesPerLine)
{
    const ChannelList &channels = header.channels();

    int pos = 0;
    for (ChannelList::ConstIterator c = channels.begin();
         c != channels.end();
         ++c, ++pos)
    {
        int xOffset = xOffsets[pos];
        int yOffset = yOffsets[pos];
        int i = 0;
        for (int y = minY - yOffset; y <= maxY - yOffset; y++, i++)
            for (int x = minX - xOffset; x <= maxX - xOffset; x++)
            {
                bytesPerLine[i] += sampleCount(sampleCountBase,
                                               sampleCountXStride,
                                               sampleCountYStride,
                                               x, y)
                                   * pixelTypeSize (c.channel().type);
            }
    }
}